

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

bool __thiscall OpenMD::FragmentStamp::addBondStamp(FragmentStamp *this,BondStamp *bond)

{
  value_type *in_RDI;
  vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool FragmentStamp::addBondStamp(BondStamp* bond) {
    bondStamps_.push_back(bond);
    return true;
  }